

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

void Json::CharReaderBuilder::strictMode(Value *settings)

{
  Value *pVVar1;
  ValueHolder local_38 [2];
  undefined8 local_28;
  
  local_28 = 0;
  Value::initBasic((Value *)local_38,booleanValue,false);
  local_38[0].uint_ = local_38[0].uint_ & 0xffffffffffffff00;
  pVVar1 = Value::resolveReference(settings,"allowComments","");
  Value::swap((Value *)local_38,pVVar1);
  Value::~Value((Value *)local_38);
  local_28 = 0;
  Value::initBasic((Value *)local_38,booleanValue,false);
  local_38[0].uint_ = local_38[0].uint_ & 0xffffffffffffff00;
  pVVar1 = Value::resolveReference(settings,"allowTrailingCommas","");
  Value::swap((Value *)local_38,pVVar1);
  Value::~Value((Value *)local_38);
  local_28 = 0;
  Value::initBasic((Value *)local_38,booleanValue,false);
  local_38[0].bool_ = true;
  pVVar1 = Value::resolveReference(settings,"strictRoot","");
  Value::swap((Value *)local_38,pVVar1);
  Value::~Value((Value *)local_38);
  local_28 = 0;
  Value::initBasic((Value *)local_38,booleanValue,false);
  local_38[0].bool_ = false;
  pVVar1 = Value::resolveReference(settings,"allowDroppedNullPlaceholders","");
  Value::swap((Value *)local_38,pVVar1);
  Value::~Value((Value *)local_38);
  local_28 = 0;
  Value::initBasic((Value *)local_38,booleanValue,false);
  local_38[0].bool_ = false;
  pVVar1 = Value::resolveReference(settings,"allowNumericKeys","");
  Value::swap((Value *)local_38,pVVar1);
  Value::~Value((Value *)local_38);
  local_28 = 0;
  Value::initBasic((Value *)local_38,booleanValue,false);
  local_38[0].uint_ = (ulong)(uint7)local_38[0]._1_7_ << 8;
  pVVar1 = Value::resolveReference(settings,"allowSingleQuotes","");
  Value::swap((Value *)local_38,pVVar1);
  Value::~Value((Value *)local_38);
  local_28 = 0;
  Value::initBasic((Value *)local_38,intValue,false);
  local_38[0].int_ = 1000;
  pVVar1 = Value::resolveReference(settings,"stackLimit","");
  Value::swap((Value *)local_38,pVVar1);
  Value::~Value((Value *)local_38);
  local_28 = 0;
  Value::initBasic((Value *)local_38,booleanValue,false);
  local_38[0].bool_ = true;
  pVVar1 = Value::resolveReference(settings,"failIfExtra","");
  Value::swap((Value *)local_38,pVVar1);
  Value::~Value((Value *)local_38);
  local_28 = 0;
  Value::initBasic((Value *)local_38,booleanValue,false);
  local_38[0].bool_ = true;
  pVVar1 = Value::resolveReference(settings,"rejectDupKeys","");
  Value::swap((Value *)local_38,pVVar1);
  Value::~Value((Value *)local_38);
  local_28 = 0;
  Value::initBasic((Value *)local_38,booleanValue,false);
  local_38[0].uint_ = (ulong)(uint7)local_38[0]._1_7_ << 8;
  pVVar1 = Value::resolveReference(settings,"allowSpecialFloats","");
  Value::swap((Value *)local_38,pVVar1);
  Value::~Value((Value *)local_38);
  return;
}

Assistant:

void CharReaderBuilder::strictMode(Json::Value* settings) {
  //! [CharReaderBuilderStrictMode]
  (*settings)["allowComments"] = false;
  (*settings)["allowTrailingCommas"] = false;
  (*settings)["strictRoot"] = true;
  (*settings)["allowDroppedNullPlaceholders"] = false;
  (*settings)["allowNumericKeys"] = false;
  (*settings)["allowSingleQuotes"] = false;
  (*settings)["stackLimit"] = 1000;
  (*settings)["failIfExtra"] = true;
  (*settings)["rejectDupKeys"] = true;
  (*settings)["allowSpecialFloats"] = false;
  //! [CharReaderBuilderStrictMode]
}